

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitffi-def.cpp
# Opt level: O1

void __thiscall JitFFI::JitFuncCallerCreaterX64::sub_rsp(JitFuncCallerCreaterX64 *this)

{
  JitFuncCreater::push(this->data,'H',0x83,0xec,'\b');
  this->sub_rsp_ptr =
       (byte *)((long)(this->data->data->jfp).data.
                      super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
               (this->data->count - 1));
  return;
}

Assistant:

void JitFuncCallerCreaterX64::sub_rsp() {
		OpCode_x64::sub_rx_byte(data, OpCode_x64::rsp, 0x8);
		sub_rsp_ptr = data.end() - 1;
	}